

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDerv.h
# Opt level: O3

void __thiscall NaPNDerivative::~NaPNDerivative(NaPNDerivative *this)

{
  (this->super_NaPetriNode)._vptr_NaPetriNode = (_func_int **)&PTR__NaPNDerivative_00177c78;
  NaVector::~NaVector(&this->vPrev);
  NaPetriCnOutput::~NaPetriCnOutput(&this->dx);
  NaPetriCnInput::~NaPetriCnInput(&this->x);
  NaPetriNode::~NaPetriNode(&this->super_NaPetriNode);
  operator_delete(this,0x128);
  return;
}

Assistant:

class PNNA_API NaPNDerivative : public NaPetriNode
{
public:

  // Create node for Petri network
  NaPNDerivative (const char* szNodeName = "derivative");


  ////////////////
  // Connectors //
  ////////////////

  // Input (mainstream)
  NaPetriCnInput	x;

  // Output (mainstream)
  NaPetriCnOutput	dx;


  ///////////////////////
  // Phases of network //
  ///////////////////////

  // 2. Link connectors inside the node
  virtual void		relate_connectors ();

  // 4. Allocate resources for internal usage
  virtual void		allocate_resources ();

  // 5. Verification to be sure all is OK (true)
  virtual bool		verify ();

  // 8. True action of the node (if activate returned true)
  virtual void		action ();

protected:/* data */

  // Vector of previous input
  NaVector		vPrev;
    
}